

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

ProcessorProperty * __thiscall
soul::StructuralParser::parseProcessorProperty(StructuralParser *this)

{
  ModuleBase *pMVar1;
  int iVar2;
  UnqualifiedName *this_00;
  ProcessorProperty *pPVar3;
  Property property;
  Context context;
  Property local_cc;
  Context local_c8;
  string local_b0;
  CompileMessage local_90;
  CompileMessage local_58;
  
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27f6e0);
  local_c8.location.sourceCode.object = (this->super_SOULTokeniser).location.sourceCode.object;
  if (local_c8.location.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_c8.location.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_c8.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_c8.location.location.data = (this->super_SOULTokeniser).location.location.data;
  local_c8.parentScope = this->currentScope;
  this_00 = parseUnqualifiedName(this);
  AST::UnqualifiedName::toString_abi_cxx11_(&local_b0,this_00);
  local_cc = heart::ProcessorProperty::getPropertyFromName(&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_cc == none) {
    CompileMessageHelpers::createMessage<>(&local_58,syntax,error,"Unknown processor property name")
    ;
    AST::Context::throwError
              (&(this_00->super_Expression).super_Statement.super_ASTObject.context,&local_58,false)
    ;
  }
  pMVar1 = (this->module).object;
  if (pMVar1 != (ModuleBase *)0x0) {
    iVar2 = (*(pMVar1->super_ASTObject)._vptr_ASTObject[4])();
    if ((char)iVar2 == '\0') {
      pMVar1 = (this->module).object;
      if (pMVar1 == (ModuleBase *)0x0) goto LAB_001d5926;
      iVar2 = (*(pMVar1->super_ASTObject)._vptr_ASTObject[5])();
      if ((char)iVar2 == '\0') {
        CompileMessageHelpers::createMessage<>
                  (&local_90,syntax,error,
                   "Processor properties are only valid inside a processor declaration");
        AST::Context::throwError(&local_c8,&local_90,false);
      }
    }
    pPVar3 = PoolAllocator::
             allocate<soul::AST::ProcessorProperty,soul::AST::Context&,soul::heart::ProcessorProperty::Property&>
                       (&this->allocator->pool,&local_c8,&local_cc);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_c8.location.sourceCode.object);
    return pPVar3;
  }
LAB_001d5926:
  throwInternalCompilerError("object != nullptr","operator->",0x3c);
}

Assistant:

AST::ProcessorProperty& parseProcessorProperty()
    {
        expect (Operator::dot);
        auto context = getContext();
        auto& propertyName = parseUnqualifiedName();

        auto property = heart::ProcessorProperty::getPropertyFromName (propertyName.toString());

        if (property == heart::ProcessorProperty::Property::none)
            propertyName.context.throwError (Errors::unknownProperty());

        if (! (module->isProcessor() || module->isGraph()))
            context.throwError (Errors::propertiesOutsideProcessor());

        return allocate<AST::ProcessorProperty> (context, property);
    }